

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCheckedActualCall.h
# Opt level: O2

cpputest_ulonglong __thiscall
MockIgnoredActualCall::returnUnsignedLongLongIntValue(MockIgnoredActualCall *this)

{
  return 0;
}

Assistant:

virtual cpputest_ulonglong returnUnsignedLongLongIntValue() _override
    {
#if CPPUTEST_USE_LONG_LONG
        return 0;
#else
        cpputest_ulonglong ret = {};
        return ret;
#endif
    }